

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlk.cpp
# Opt level: O0

int __thiscall
pg::ZLKSolver::attractPar
          (ZLKSolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int i,int r,
          vector<int,_std::allocator<int>_> *R)

{
  int *piVar1;
  uint uVar2;
  uint arg_1;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  bool bVar7;
  int local_6c;
  int k;
  par_helper *x;
  int j_2;
  int j_1;
  size_t to_reserve;
  int _r;
  int spawn_count;
  par_helper *ours;
  int j;
  int W;
  int pl;
  int pr;
  vector<int,_std::allocator<int>_> *R_local;
  int r_local;
  int i_local;
  Task *__lace_dq_head_local;
  WorkerP *__lace_worker_local;
  ZLKSolver *this_local;
  
  uVar2 = Solver::priority(&this->super_Solver,i);
  arg_1 = uVar2 & 1;
  uVar3 = lace_workers();
  for (ours._0_4_ = 0; (int)ours < (int)uVar3; ours._0_4_ = (int)ours + 1) {
    **(undefined4 **)(pvec + (long)(int)ours * 8) = 0;
  }
  piVar1 = *(int **)(pvec + (ulong)__lace_worker->worker * 8);
  to_reserve._4_4_ = 0;
  _r_local = __lace_dq_head;
  for (R_local._4_4_ = i; -1 < R_local._4_4_; R_local._4_4_ = R_local._4_4_ + -1) {
    to_reserve._0_4_ = this->region[R_local._4_4_];
    if (((int)to_reserve != -0x80000000) && ((int)to_reserve < 0)) {
      if (((this->to_inversion & 1U) == 0) &&
         (uVar4 = Solver::priority(&this->super_Solver,R_local._4_4_), uVar4 != uVar2)) break;
      uVar4 = Solver::priority(&this->super_Solver,R_local._4_4_);
      if ((uVar4 & 1) == arg_1) {
        if (to_reserve._4_4_ == 0) {
          this->region[R_local._4_4_] = r;
        }
        else {
          do {
            LOCK();
            bVar7 = (int)to_reserve == this->region[R_local._4_4_];
            if (bVar7) {
              this->region[R_local._4_4_] = r;
            }
            UNLOCK();
            to_reserve._0_4_ = r;
            if (bVar7) goto LAB_001bf64a;
            to_reserve._0_4_ = this->region[R_local._4_4_];
          } while ((int)to_reserve < 0);
          to_reserve._0_4_ = -0x7fffffff;
LAB_001bf64a:
          if ((int)to_reserve == -0x7fffffff) goto LAB_001bf6bf;
        }
        this->winning[R_local._4_4_] = arg_1;
        this->strategy[R_local._4_4_] = -1;
        iVar5 = *piVar1;
        *piVar1 = iVar5 + 1;
        piVar1[(long)iVar5 + 1] = R_local._4_4_;
        attractParT_SPAWN(__lace_worker,_r_local,arg_1,R_local._4_4_,r,this);
        _r_local = _r_local + 1;
        to_reserve._4_4_ = to_reserve._4_4_ + 1;
      }
      else {
        for (; to_reserve._4_4_ != 0; to_reserve._4_4_ = to_reserve._4_4_ + -1) {
          _r_local = _r_local + -1;
          attractParT_SYNC(__lace_worker,_r_local);
        }
        if ((int)to_reserve < 0) break;
      }
    }
LAB_001bf6bf:
  }
  for (; to_reserve._4_4_ != 0; to_reserve._4_4_ = to_reserve._4_4_ + -1) {
    _r_local = _r_local + -1;
    attractParT_SYNC(__lace_worker,_r_local);
  }
  _j_2 = std::vector<int,_std::allocator<int>_>::size(R);
  for (x._4_4_ = 0; x._4_4_ < (int)uVar3; x._4_4_ = x._4_4_ + 1) {
    _j_2 = (long)**(int **)(pvec + (long)x._4_4_ * 8) + _j_2;
  }
  std::vector<int,_std::allocator<int>_>::reserve(R,_j_2);
  for (x._0_4_ = 0; (int)x < (int)uVar3; x._0_4_ = (int)x + 1) {
    piVar1 = *(int **)(pvec + (long)(int)x * 8);
    for (local_6c = 0; local_6c < *piVar1; local_6c = local_6c + 1) {
      if (1 < (this->super_Solver).trace) {
        poVar6 = std::operator<<((this->super_Solver).logger,"attracted ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar1[(long)local_6c + 1]);
        poVar6 = std::operator<<(poVar6," (");
        iVar5 = Solver::priority(&this->super_Solver,piVar1[(long)local_6c + 1]);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
        poVar6 = std::operator<<(poVar6,")");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      std::vector<int,_std::allocator<int>_>::push_back(R,piVar1 + (long)local_6c + 1);
    }
    *piVar1 = 0;
  }
  return R_local._4_4_;
}

Assistant:

int
ZLKSolver::attractPar(WorkerP* __lace_worker, Task* __lace_dq_head, int i, int r, std::vector<int>* R)
{
    const int pr = priority(i);
    const int pl = pr & 1;

    // initialize pvec (set count to 0) for all workers
    const int W = lace_workers();
    for (int j=0; j<W; j++) pvec[j]->count = 0;

    par_helper* ours = pvec[LACE_WORKER_ID];
    int spawn_count = 0;

    for (; i>=0; i--) {
        int _r = region[i];
        if (_r == DIS or _r >= 0) continue; // not in subgame or attracted
        if (!to_inversion and priority(i) != pr) break;
        if ((priority(i)&1) != pl) { // search until parity inversion
            // first SYNC on all children, who knows this node may be attracted
            while (spawn_count) { SYNC(attractParT); spawn_count--; }
            // after SYNC, check if node <i> is now attracted.
            if (_r < 0) break; // not attracted, so we're done!
            else continue; // already done
        }

        // if c != 0, then we compete with attractParT and must use compare and swap
        if (spawn_count == 0) {
            region[i] = r; // just set, no competing threads
        } else {
            // competing threads! use compare and swap [in a loop]
            while (true) {
                if (__sync_bool_compare_and_swap(&region[i], _r, r)) {
                    _r = r;
                    break;
                }
                _r = *(volatile int*)&region[i];
                if (_r < 0) continue;
                _r = BOT;
                break;
            }
            if (_r == BOT) continue; // someone else claimed!
        }

        winning[i] = pl;
        strategy[i] = -1; // head nodes have no strategy (for now)
        ours->items[ours->count++] = i;
        SPAWN(attractParT, pl, i, r, this);
        spawn_count++;
    }

    // first SYNC on all children (if any)
    while (spawn_count) { SYNC(attractParT); spawn_count--; }

    // update R
    size_t to_reserve = R->size();
    for (int j=0; j<W; j++) to_reserve += pvec[j]->count;
    R->reserve(to_reserve);

    for (int j=0; j<W; j++) {
        par_helper* x = pvec[j];
        for (int k=0; k<x->count; k++) {
#ifndef NDEBUG
            if (trace >= 2) logger << "attracted " << x->items[k] << " (" << priority(x->items[k]) << ")" << std::endl;
#endif
            R->push_back(x->items[k]);
        }
        x->count = 0;
    }

    return i;
}